

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

optional<pbrt::CameraRayDifferential> *
pbrt::CameraBase::GenerateRayDifferential
          (Camera *camera,CameraSample sample,SampledWavelengths *lambda)

{
  Vector3<float> c;
  Vector3<float> c_00;
  Point3<float> p;
  Vector3<float> v;
  Vector3<float> c_01;
  Vector3<float> c_02;
  undefined1 auVar1 [16];
  CameraSample sample_00;
  CameraSample sample_01;
  CameraSample sample_02;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  CameraRayDifferential *pCVar15;
  bool bVar16;
  CameraRay *pCVar17;
  optional<pbrt::CameraRayDifferential> *in_RDI;
  undefined8 uVar18;
  Vector3<float> VVar19;
  Point3<float> PVar20;
  CameraRayDifferential *in_stack_00000008;
  optional<pbrt::CameraRayDifferential> *in_stack_00000010;
  optional<pbrt::CameraRay> *in_stack_00000018;
  CameraSample sshift_1;
  Float eps_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  initializer_list<float> *__range1_1;
  optional<pbrt::CameraRay> ry;
  CameraSample sshift;
  Float eps;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<float> *__range1;
  optional<pbrt::CameraRay> rx;
  RayDifferential rd;
  optional<pbrt::CameraRay> cr;
  CameraRayDifferential *v_00;
  optional<pbrt::CameraRayDifferential> *this;
  optional<pbrt::CameraRay> *poVar21;
  optional<pbrt::CameraRay> *in_stack_fffffffffffff880;
  undefined8 *puVar22;
  Camera *in_stack_fffffffffffff888;
  undefined1 in_stack_fffffffffffff890;
  undefined1 in_stack_fffffffffffff891;
  undefined1 in_stack_fffffffffffff892;
  undefined1 in_stack_fffffffffffff893;
  undefined4 in_stack_fffffffffffff894;
  float in_stack_fffffffffffff898;
  undefined8 in_stack_fffffffffffff8a0;
  undefined1 in_stack_fffffffffffff8a8 [12];
  Float in_stack_fffffffffffff8b4;
  undefined8 local_510 [2];
  undefined8 local_500;
  float local_4f8;
  undefined8 local_4f0;
  float local_4e8;
  undefined8 local_4e0;
  float local_4d8;
  undefined8 local_4d0;
  float local_4c8;
  undefined8 local_4c0;
  undefined4 local_4b8;
  undefined8 local_4b0;
  undefined4 local_4a8;
  undefined8 local_4a0;
  float local_498;
  undefined8 local_490;
  float local_488;
  undefined8 local_484;
  float local_47c;
  undefined8 local_478;
  float local_470;
  undefined8 local_468;
  float local_460;
  undefined8 local_458;
  float local_450;
  undefined8 local_448;
  float local_440;
  undefined8 local_438;
  undefined4 local_430;
  undefined8 local_428;
  undefined4 local_420;
  undefined8 local_418;
  float local_410;
  undefined8 local_408;
  float local_400;
  undefined8 local_3f8;
  float local_3f0;
  CameraRayDifferential *local_3e8;
  undefined8 local_388;
  float local_364;
  float *local_360;
  float *local_358;
  float local_350 [2];
  initializer_list<float> local_348;
  initializer_list<float> *local_338;
  optional<pbrt::CameraRay> local_330;
  undefined8 local_2f0;
  float local_2e8;
  undefined8 local_2e0;
  float local_2d8;
  undefined8 local_2d0;
  float local_2c8;
  undefined8 local_2c0;
  float local_2b8;
  undefined8 local_2b0;
  undefined4 local_2a8;
  undefined8 local_2a0;
  undefined4 local_298;
  undefined8 local_290;
  float local_288;
  undefined8 local_280;
  float local_278;
  undefined8 local_274;
  float local_26c;
  undefined8 local_268;
  float local_260;
  undefined8 local_258;
  float local_250;
  undefined8 local_248;
  float local_240;
  undefined8 local_238;
  float local_230;
  undefined8 local_228;
  undefined4 local_220;
  undefined8 local_218;
  undefined4 local_210;
  undefined8 local_208;
  float local_200;
  undefined8 local_1f8;
  float local_1f0;
  undefined8 local_1e8;
  float local_1e0;
  CameraRayDifferential *local_1d8;
  undefined8 local_178;
  float local_15c;
  float *local_158;
  float *local_150;
  float local_148 [2];
  initializer_list<float> local_140;
  initializer_list<float> *local_130;
  optional<pbrt::CameraRay> local_128;
  undefined8 local_e8;
  undefined4 local_e0;
  undefined8 local_dc;
  undefined4 local_d4;
  undefined1 local_c0;
  undefined8 local_bc;
  float local_b4;
  undefined8 local_b0;
  float local_a8;
  undefined8 local_a4;
  float local_9c;
  undefined8 local_98;
  float local_90;
  undefined4 local_88;
  optional local_58 [88];
  
  sample_00._8_12_ = in_stack_fffffffffffff8a8;
  sample_00.pFilm.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)in_stack_fffffffffffff8a0;
  sample_00.filterWeight = in_stack_fffffffffffff8b4;
  v_00 = in_stack_00000008;
  this = in_stack_00000010;
  Camera::GenerateRay(in_stack_fffffffffffff888,sample_00,
                      (SampledWavelengths *)in_stack_fffffffffffff880);
  bVar16 = pstd::optional::operator_cast_to_bool(local_58);
  if (bVar16) {
    pstd::optional<pbrt::CameraRay>::operator->((optional<pbrt::CameraRay> *)0x860976);
    RayDifferential::RayDifferential((RayDifferential *)this,(Ray *)v_00);
    pstd::optional<pbrt::CameraRay>::optional(&local_128);
    local_148[0] = 0.05;
    local_148[1] = -0.05;
    local_140._M_array = local_148;
    local_140._M_len = 2;
    local_130 = &local_140;
    local_150 = std::initializer_list<float>::begin(local_130);
    local_158 = std::initializer_list<float>::end((initializer_list<float> *)this);
    while( true ) {
      pCVar15 = local_178;
      local_178._0_4_ = SUB84(in_stack_00000008,0);
      fVar13 = (float)local_178;
      local_178._4_4_ = (float)((ulong)in_stack_00000008 >> 0x20);
      fVar14 = local_178._4_4_;
      if (local_150 == local_158) break;
      local_15c = *local_150;
      local_178 = (CameraRayDifferential *)CONCAT44(local_178._4_4_,(float)local_178 + local_15c);
      local_1d8 = local_178;
      sample_01.pLens.super_Tuple2<pbrt::Point2,_float>.x =
           (float)(int)in_stack_fffffffffffff8a8._0_8_;
      sample_01.pLens.super_Tuple2<pbrt::Point2,_float>.y =
           (float)(int)((ulong)in_stack_fffffffffffff8a8._0_8_ >> 0x20);
      sample_01.time = (Float)in_stack_fffffffffffff8a8._8_4_;
      sample_01.pFilm.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)in_stack_fffffffffffff8a0;
      sample_01.pFilm.super_Tuple2<pbrt::Point2,_float>.y =
           (float)(int)((ulong)in_stack_fffffffffffff8a0 >> 0x20);
      sample_01.filterWeight = in_stack_fffffffffffff8b4;
      v_00 = local_178;
      this = in_stack_00000010;
      poVar21 = in_stack_00000018;
      Camera::GenerateRay(in_stack_fffffffffffff888,sample_01,
                          (SampledWavelengths *)in_stack_fffffffffffff880);
      pstd::optional<pbrt::CameraRay>::operator=(in_stack_fffffffffffff880,poVar21);
      pstd::optional<pbrt::CameraRay>::~optional((optional<pbrt::CameraRay> *)0x860b08);
      bVar16 = pstd::optional::operator_cast_to_bool((optional *)&local_128);
      if (bVar16) {
        pstd::optional<pbrt::CameraRay>::operator->((optional<pbrt::CameraRay> *)0x860b4b);
        local_210 = local_e0;
        local_218 = local_e8;
        local_220 = local_e0;
        local_228 = local_e8;
        uVar18 = 0;
        PVar20.super_Tuple3<pbrt::Point3,_float>.x._1_1_ = in_stack_fffffffffffff891;
        PVar20.super_Tuple3<pbrt::Point3,_float>.x._0_1_ = in_stack_fffffffffffff890;
        PVar20.super_Tuple3<pbrt::Point3,_float>.x._2_1_ = in_stack_fffffffffffff892;
        PVar20.super_Tuple3<pbrt::Point3,_float>.x._3_1_ = in_stack_fffffffffffff893;
        PVar20.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffff894;
        PVar20.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff898;
        VVar19 = Point3<float>::operator-((Point3<float> *)poVar21,PVar20);
        local_230 = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar12._8_8_ = uVar18;
        auVar12._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_238 = vmovlpd_avx(auVar12);
        uVar18 = 0;
        local_208 = local_238;
        local_200 = local_230;
        VVar19 = Tuple3<pbrt::Vector3,float>::operator/
                           ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffff880,
                            (float)((ulong)poVar21 >> 0x20));
        local_250 = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar11._8_8_ = uVar18;
        auVar11._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_258 = vmovlpd_avx(auVar11);
        uVar18 = 0;
        VVar19.super_Tuple3<pbrt::Vector3,_float>.x._1_1_ = in_stack_fffffffffffff891;
        VVar19.super_Tuple3<pbrt::Vector3,_float>.x._0_1_ = in_stack_fffffffffffff890;
        VVar19.super_Tuple3<pbrt::Vector3,_float>.x._2_1_ = in_stack_fffffffffffff892;
        VVar19.super_Tuple3<pbrt::Vector3,_float>.x._3_1_ = in_stack_fffffffffffff893;
        VVar19.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffff894;
        VVar19.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff898;
        local_248 = local_258;
        local_240 = local_250;
        local_1f8 = local_258;
        local_1f0 = local_250;
        PVar20 = Point3<float>::operator+((Point3<float> *)poVar21,VVar19);
        local_260 = PVar20.super_Tuple3<pbrt::Point3,_float>.z;
        auVar10._8_8_ = uVar18;
        auVar10._0_8_ = PVar20.super_Tuple3<pbrt::Point3,_float>._0_8_;
        local_268 = vmovlpd_avx(auVar10);
        local_1e8 = local_268;
        local_1e0 = local_260;
        local_bc = local_268;
        local_b4 = local_260;
        pstd::optional<pbrt::CameraRay>::operator->((optional<pbrt::CameraRay> *)0x860d40);
        local_298 = local_d4;
        local_2a0 = local_dc;
        local_2a8 = local_d4;
        local_2b0 = local_dc;
        uVar18 = 0;
        c.super_Tuple3<pbrt::Vector3,_float>.x._1_1_ = in_stack_fffffffffffff891;
        c.super_Tuple3<pbrt::Vector3,_float>.x._0_1_ = in_stack_fffffffffffff890;
        c.super_Tuple3<pbrt::Vector3,_float>.x._2_1_ = in_stack_fffffffffffff892;
        c.super_Tuple3<pbrt::Vector3,_float>.x._3_1_ = in_stack_fffffffffffff893;
        c.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffff894;
        c.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff898;
        VVar19 = Tuple3<pbrt::Vector3,float>::operator-((Tuple3<pbrt::Vector3,_float> *)poVar21,c);
        local_2b8 = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar9._8_8_ = uVar18;
        auVar9._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_2c0 = vmovlpd_avx(auVar9);
        uVar18 = 0;
        local_290 = local_2c0;
        local_288 = local_2b8;
        VVar19 = Tuple3<pbrt::Vector3,float>::operator/
                           ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffff880,
                            (float)((ulong)poVar21 >> 0x20));
        local_2d8 = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar8._8_8_ = uVar18;
        auVar8._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_2e0 = vmovlpd_avx(auVar8);
        uVar18 = 0;
        c_00.super_Tuple3<pbrt::Vector3,_float>.x._1_1_ = in_stack_fffffffffffff891;
        c_00.super_Tuple3<pbrt::Vector3,_float>.x._0_1_ = in_stack_fffffffffffff890;
        c_00.super_Tuple3<pbrt::Vector3,_float>.x._2_1_ = in_stack_fffffffffffff892;
        c_00.super_Tuple3<pbrt::Vector3,_float>.x._3_1_ = in_stack_fffffffffffff893;
        c_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffff894;
        c_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff898;
        local_2d0 = local_2e0;
        local_2c8 = local_2d8;
        local_280 = local_2e0;
        local_278 = local_2d8;
        VVar19 = Tuple3<pbrt::Vector3,float>::operator+
                           ((Tuple3<pbrt::Vector3,_float> *)poVar21,c_00);
        local_2e8 = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar7._8_8_ = uVar18;
        auVar7._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_2f0 = vmovlpd_avx(auVar7);
        local_274 = local_2f0;
        local_26c = local_2e8;
        pCVar15 = local_178;
        local_a4 = local_2f0;
        local_9c = local_2e8;
        break;
      }
      local_150 = local_150 + 1;
    }
    local_178 = pCVar15;
    pstd::optional<pbrt::CameraRay>::optional(&local_330);
    local_350[0] = 0.05;
    local_350[1] = -0.05;
    local_348._M_array = local_350;
    local_348._M_len = 2;
    local_338 = &local_348;
    local_358 = std::initializer_list<float>::begin(local_338);
    local_360 = std::initializer_list<float>::end((initializer_list<float> *)this);
    for (; local_358 != local_360; local_358 = local_358 + 1) {
      local_364 = *local_358;
      local_388 = (CameraRayDifferential *)CONCAT44(fVar14 + local_364,fVar13);
      local_3e8 = local_388;
      sample_02.pLens.super_Tuple2<pbrt::Point2,_float>.x =
           (float)(int)in_stack_fffffffffffff8a8._0_8_;
      sample_02.pLens.super_Tuple2<pbrt::Point2,_float>.y =
           (float)(int)((ulong)in_stack_fffffffffffff8a8._0_8_ >> 0x20);
      sample_02.time = (Float)in_stack_fffffffffffff8a8._8_4_;
      sample_02.pFilm.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)in_stack_fffffffffffff8a0;
      sample_02.pFilm.super_Tuple2<pbrt::Point2,_float>.y =
           (float)(int)((ulong)in_stack_fffffffffffff8a0 >> 0x20);
      sample_02.filterWeight = in_stack_fffffffffffff8b4;
      v_00 = local_388;
      this = in_stack_00000010;
      poVar21 = in_stack_00000018;
      Camera::GenerateRay(in_stack_fffffffffffff888,sample_02,
                          (SampledWavelengths *)in_stack_fffffffffffff880);
      pstd::optional<pbrt::CameraRay>::operator=(in_stack_fffffffffffff880,poVar21);
      pstd::optional<pbrt::CameraRay>::~optional((optional<pbrt::CameraRay> *)0x8610e9);
      bVar16 = pstd::optional::operator_cast_to_bool((optional *)&local_330);
      if (bVar16) {
        pstd::optional<pbrt::CameraRay>::operator->((optional<pbrt::CameraRay> *)0x86112c);
        local_420 = local_e0;
        local_428 = local_e8;
        local_430 = local_e0;
        local_438 = local_e8;
        uVar18 = 0;
        p.super_Tuple3<pbrt::Point3,_float>.x._1_1_ = in_stack_fffffffffffff891;
        p.super_Tuple3<pbrt::Point3,_float>.x._0_1_ = in_stack_fffffffffffff890;
        p.super_Tuple3<pbrt::Point3,_float>.x._2_1_ = in_stack_fffffffffffff892;
        p.super_Tuple3<pbrt::Point3,_float>.x._3_1_ = in_stack_fffffffffffff893;
        p.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffff894;
        p.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff898;
        VVar19 = Point3<float>::operator-((Point3<float> *)poVar21,p);
        local_440 = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar6._8_8_ = uVar18;
        auVar6._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_448 = vmovlpd_avx(auVar6);
        uVar18 = 0;
        local_418 = local_448;
        local_410 = local_440;
        VVar19 = Tuple3<pbrt::Vector3,float>::operator/
                           ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffff880,
                            (float)((ulong)poVar21 >> 0x20));
        local_460 = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar5._8_8_ = uVar18;
        auVar5._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_468 = vmovlpd_avx(auVar5);
        uVar18 = 0;
        v.super_Tuple3<pbrt::Vector3,_float>.x._1_1_ = in_stack_fffffffffffff891;
        v.super_Tuple3<pbrt::Vector3,_float>.x._0_1_ = in_stack_fffffffffffff890;
        v.super_Tuple3<pbrt::Vector3,_float>.x._2_1_ = in_stack_fffffffffffff892;
        v.super_Tuple3<pbrt::Vector3,_float>.x._3_1_ = in_stack_fffffffffffff893;
        v.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffff894;
        v.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff898;
        local_458 = local_468;
        local_450 = local_460;
        local_408 = local_468;
        local_400 = local_460;
        PVar20 = Point3<float>::operator+((Point3<float> *)poVar21,v);
        local_470 = PVar20.super_Tuple3<pbrt::Point3,_float>.z;
        auVar4._8_8_ = uVar18;
        auVar4._0_8_ = PVar20.super_Tuple3<pbrt::Point3,_float>._0_8_;
        local_478 = vmovlpd_avx(auVar4);
        local_3f8 = local_478;
        local_3f0 = local_470;
        local_b0 = local_478;
        local_a8 = local_470;
        pstd::optional<pbrt::CameraRay>::operator->((optional<pbrt::CameraRay> *)0x861321);
        local_4a8 = local_d4;
        local_4b0 = local_dc;
        local_4b8 = local_d4;
        local_4c0 = local_dc;
        uVar18 = 0;
        c_01.super_Tuple3<pbrt::Vector3,_float>.x._1_1_ = in_stack_fffffffffffff891;
        c_01.super_Tuple3<pbrt::Vector3,_float>.x._0_1_ = in_stack_fffffffffffff890;
        c_01.super_Tuple3<pbrt::Vector3,_float>.x._2_1_ = in_stack_fffffffffffff892;
        c_01.super_Tuple3<pbrt::Vector3,_float>.x._3_1_ = in_stack_fffffffffffff893;
        c_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffff894;
        c_01.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff898;
        VVar19 = Tuple3<pbrt::Vector3,float>::operator-
                           ((Tuple3<pbrt::Vector3,_float> *)poVar21,c_01);
        local_4c8 = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar3._8_8_ = uVar18;
        auVar3._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_4d0 = vmovlpd_avx(auVar3);
        uVar18 = 0;
        local_4a0 = local_4d0;
        local_498 = local_4c8;
        VVar19 = Tuple3<pbrt::Vector3,float>::operator/
                           ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffff880,
                            (float)((ulong)poVar21 >> 0x20));
        local_4e8 = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar2._8_8_ = uVar18;
        auVar2._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_4f0 = vmovlpd_avx(auVar2);
        uVar18 = 0;
        c_02.super_Tuple3<pbrt::Vector3,_float>.x._1_1_ = in_stack_fffffffffffff891;
        c_02.super_Tuple3<pbrt::Vector3,_float>.x._0_1_ = in_stack_fffffffffffff890;
        c_02.super_Tuple3<pbrt::Vector3,_float>.x._2_1_ = in_stack_fffffffffffff892;
        c_02.super_Tuple3<pbrt::Vector3,_float>.x._3_1_ = in_stack_fffffffffffff893;
        c_02.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffff894;
        c_02.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff898;
        local_4e0 = local_4f0;
        local_4d8 = local_4e8;
        local_490 = local_4f0;
        local_488 = local_4e8;
        VVar19 = Tuple3<pbrt::Vector3,float>::operator+
                           ((Tuple3<pbrt::Vector3,_float> *)poVar21,c_02);
        local_4f8 = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar1._8_8_ = uVar18;
        auVar1._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_500 = vmovlpd_avx(auVar1);
        local_484 = local_500;
        local_47c = local_4f8;
        local_98 = local_500;
        local_90 = local_4f8;
        break;
      }
    }
    bVar16 = pstd::optional::operator_cast_to_bool((optional *)&local_128);
    local_c0 = false;
    if (bVar16) {
      local_c0 = pstd::optional::operator_cast_to_bool((optional *)&local_330);
    }
    RayDifferential::RayDifferential((RayDifferential *)this,&v_00->ray);
    puVar22 = local_510;
    pCVar17 = pstd::optional<pbrt::CameraRay>::operator->((optional<pbrt::CameraRay> *)0x8615b4);
    uVar18 = *(undefined8 *)((pCVar17->weight).values.values + 2);
    *puVar22 = *(undefined8 *)(pCVar17->weight).values.values;
    puVar22[1] = uVar18;
    pstd::optional<pbrt::CameraRayDifferential>::optional(this,v_00);
    local_88 = 1;
    pstd::optional<pbrt::CameraRay>::~optional((optional<pbrt::CameraRay> *)0x8615fd);
    pstd::optional<pbrt::CameraRay>::~optional((optional<pbrt::CameraRay> *)0x86160a);
  }
  else {
    memset(in_RDI,0,0x78);
    pstd::optional<pbrt::CameraRayDifferential>::optional(in_RDI);
    local_88 = 1;
  }
  pstd::optional<pbrt::CameraRay>::~optional((optional<pbrt::CameraRay> *)0x861635);
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU pstd::optional<CameraRayDifferential> CameraBase::GenerateRayDifferential(
    Camera camera, CameraSample sample, SampledWavelengths &lambda) {
    // Generate regular camera ray _cr_ for ray differential
    pstd::optional<CameraRay> cr = camera.GenerateRay(sample, lambda);
    if (!cr)
        return {};
    RayDifferential rd(cr->ray);

    // Find camera ray after shifting one pixel in the $x$ direction
    pstd::optional<CameraRay> rx;
    for (Float eps : {.05f, -.05f}) {
        CameraSample sshift = sample;
        sshift.pFilm.x += eps;
        // Try to generate ray with _sshift_ and compute $x$ differential
        if (rx = camera.GenerateRay(sshift, lambda); rx) {
            rd.rxOrigin = rd.o + (rx->ray.o - rd.o) / eps;
            rd.rxDirection = rd.d + (rx->ray.d - rd.d) / eps;
            break;
        }
    }

    // Find camera ray after shifting one pixel in the $y$ direction
    pstd::optional<CameraRay> ry;
    for (Float eps : {.05f, -.05f}) {
        CameraSample sshift = sample;
        sshift.pFilm.y += eps;
        if (ry = camera.GenerateRay(sshift, lambda); ry) {
            rd.ryOrigin = rd.o + (ry->ray.o - rd.o) / eps;
            rd.ryDirection = rd.d + (ry->ray.d - rd.d) / eps;
            break;
        }
    }

    // Return approximate ray differential and weight
    rd.hasDifferentials = rx && ry;
    return CameraRayDifferential{rd, cr->weight};
}